

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_reader_init_filename(mpack_reader_t *reader,char *filename)

{
  FILE *file_00;
  FILE *file;
  char *filename_local;
  mpack_reader_t *reader_local;
  
  file_00 = fopen(filename,"rb");
  if (file_00 == (FILE *)0x0) {
    mpack_reader_init_error(reader,mpack_error_io);
  }
  else {
    mpack_reader_init_stdfile(reader,(FILE *)file_00,true);
  }
  return;
}

Assistant:

void mpack_reader_init_filename(mpack_reader_t* reader, const char* filename) {
    mpack_assert(filename != NULL, "filename is NULL");

    FILE* file = fopen(filename, "rb");
    if (file == NULL) {
        mpack_reader_init_error(reader, mpack_error_io);
        return;
    }

    mpack_reader_init_stdfile(reader, file, true);
}